

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O0

void Ppmd8_Init(CPpmd8 *p,uint maxOrder,uint restoreMethod)

{
  uint restoreMethod_local;
  uint maxOrder_local;
  CPpmd8 *p_local;
  
  p->MaxOrder = maxOrder;
  p->RestoreMethod = restoreMethod;
  RestartModel(p);
  (p->DummySee).Shift = '\a';
  (p->DummySee).Summ = 0;
  (p->DummySee).Count = '@';
  return;
}

Assistant:

void Ppmd8_Init(CPpmd8 *p, unsigned maxOrder, unsigned restoreMethod)
{
  p->MaxOrder = maxOrder;
  p->RestoreMethod = restoreMethod;
  RestartModel(p);
  p->DummySee.Shift = PPMD_PERIOD_BITS;
  p->DummySee.Summ = 0; /* unused */
  p->DummySee.Count = 64; /* unused */
}